

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O1

void __thiscall
OpenMD::DisplacementZ::correlateFrames(DisplacementZ *this,int frame1,int frame2,int timeBin)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  int *piVar2;
  int *piVar3;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  Vector3d local_48;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_68,
             (this->super_ObjectACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele1ToIndex_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame1);
  pvVar1 = &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
            super_AutoCorrFunc<OpenMD::Vector3<double>_>.
            super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele1ToIndex_;
  if ((this->super_ObjectACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>
      .super_TimeCorrFunc<OpenMD::Vector3<double>_>.uniqueSelections_ != false) {
    pvVar1 = &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.sele2ToIndex_;
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_88,
             (pvVar1->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + frame2);
  piVar2 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    while (piVar2 != local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
      if (piVar3 != local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (*piVar2 <= *piVar3) break;
          piVar3 = piVar3 + 1;
        } while (piVar3 != local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if (piVar2 != local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (*piVar3 <= *piVar2) break;
          piVar2 = piVar2 + 1;
        } while (piVar2 != local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if ((piVar3 == local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
         (piVar2 == local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish)) break;
      calcCorrValImpl(&local_48,this,frame1,frame2,
                      (int)((ulong)((long)piVar3 -
                                   (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2),
                      (int)((ulong)((long)piVar2 -
                                   (long)local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2),timeBin);
      piVar3 = piVar3 + 1;
      piVar2 = piVar2 + 1;
      if (piVar3 == local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
    }
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DisplacementZ::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    s1 = sele1ToIndex_[frame1];

    if (uniqueSelections_)
      s2 = sele2ToIndex_[frame2];
    else
      s2 = sele1ToIndex_[frame2];

    for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
         ++i1, ++i2) {
      // If the selections are dynamic, they might not have the
      // same objects in both frames, so we need to roll either of
      // the selections until we have the same object to
      // correlate.

      while (i1 != s1.end() && *i1 < *i2) {
        ++i1;
      }

      while (i2 != s2.end() && *i2 < *i1) {
        ++i2;
      }

      if (i1 == s1.end() || i2 == s2.end()) break;

      calcCorrValImpl(frame1, frame2, i1 - s1.begin(), i2 - s2.begin(),
                      timeBin);
    }
  }